

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

int CoreVfprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  LPCWSTR lpWideCharStr;
  FILE *pFVar1;
  int Type_00;
  BOOL BVar2;
  uint uVar3;
  INT IVar4;
  int iVar5;
  DWORD DVar6;
  INT *pIVar7;
  ulong uVar8;
  LPSTR lpMultiByteStr;
  LPSTR pCVar9;
  INT *pIVar10;
  byte *pbVar11;
  undefined8 *puVar12;
  size_t sVar13;
  short *psVar14;
  int *piVar15;
  uint *puVar16;
  WCHAR *pWVar17;
  uint uVar18;
  CPalThread *pCVar19;
  CPalThread *pthrCurrent_00;
  undefined8 uVar20;
  int iVar21;
  long in_FS_OFFSET;
  ulong uStack_4a8;
  CHAR TempBuffer [5];
  uint local_48c;
  int local_488;
  INT Prefix;
  INT Type;
  LPCSTR Fmt;
  INT *local_470;
  WCHAR local_466;
  uint local_464;
  uint uStack_460;
  WCHAR TempWChar;
  INT Flags;
  INT Precision;
  INT Width;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  Precision = aparg->gp_offset;
  Width = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  local_470 = &stream->PALferrorCode;
  Fmt._4_4_ = -1;
  iVar21 = 0;
  pIVar7 = local_470;
  _Type = (CPalThread *)format;
LAB_001efe17:
  while( true ) {
    if (*(char *)&_Type->_vptr_CPalThread == '%') break;
    if (*(char *)&_Type->_vptr_CPalThread == '\0') goto LAB_001f06db;
LAB_001efed5:
    pCVar19 = _Type;
    _Type = (CPalThread *)((long)&_Type->_vptr_CPalThread + 1);
    CorUnix::InternalFwrite(pCVar19,1,1,stream->bsdFilePtr,pIVar7);
    if (stream->PALferrorCode == 1) {
LAB_001f05a6:
      iVar21 = Fmt._4_4_;
      if (PAL_InitializeChakraCoreCalled != false) {
LAB_001f06db:
        Fmt._4_4_ = iVar21;
        if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
          __stack_chk_fail();
        }
        return Fmt._4_4_;
      }
      goto LAB_001f05b6;
    }
    iVar21 = iVar21 + 1;
  }
  pCVar19 = _Type;
  BVar2 = Internal_ExtractFormatA
                    (_Type,(LPCSTR *)&Type,local_438,(LPINT)&local_464,&Flags,
                     (LPINT)&stack0xfffffffffffffba0,(LPINT)&local_48c,&local_488);
  uVar20 = ap[0]._0_8_;
  IVar4 = Flags;
  uVar18 = local_464;
  pIVar10 = local_470;
  Type_00 = local_488;
  uVar3 = local_48c;
  if (BVar2 == 0) goto LAB_001efed5;
  ap[0].reg_save_area._4_4_ = iVar21;
  if (local_488 != 2 || (local_48c ^ 2) != 0) {
    if ((local_48c ^ 2) == 0 && local_488 == 1) {
      uVar3 = Precision;
      if (Flags + 3U < 2) {
        if ((uint)Precision < 0x29) {
          uVar3 = Precision + 8;
          _Precision = CONCAT44(Width,uVar3);
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if ((uStack_460 & 0xfffffffd) == 0xfffffffc) {
        if (uVar3 < 0x29) {
          uVar3 = uVar3 + 8;
          _Precision = CONCAT44(Width,uVar3);
          goto LAB_001f01bc;
        }
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_001f021f:
        pWVar17 = (WCHAR *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      else {
LAB_001f01bc:
        if (0x28 < uVar3) goto LAB_001f021f;
        _Precision = CONCAT44(Width,uVar3 + 8);
        pWVar17 = (WCHAR *)((ulong)uVar3 + (long)ap[0].overflow_arg_area);
      }
      local_466 = *pWVar17;
      pCVar19 = (CPalThread *)0x0;
      iVar21 = WideCharToMultiByte(0,0,&local_466,1,(LPSTR)&uStack_4a8,5,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar21 == 0) {
        uVar20 = 0x958;
        goto LAB_001f0641;
      }
      TempBuffer[(long)iVar21 + -8] = '\0';
      IVar4 = Internal_AddPaddingVfprintf
                        (pCVar19,stream,(LPSTR)&uStack_4a8,IVar4 - iVar21,local_464);
      if (IVar4 == -1) goto LAB_001f05a6;
      iVar21 = ap[0].reg_save_area._4_4_ + IVar4;
    }
    else if (local_488 == 6) {
      if (Flags == -2) {
        uVar8 = _Precision & 0xffffffff;
        if (uVar8 < 0x29) {
          _Precision = CONCAT44(Width,Precision + 8);
          pIVar10 = (INT *)(uVar8 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar10 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Flags = *pIVar10;
      }
      if (uStack_460 == 0xfffffffe) {
        uVar8 = _Precision & 0xffffffff;
        if (uVar8 < 0x29) {
          _Precision = CONCAT44(Width,Precision + 8);
          puVar16 = (uint *)(uVar8 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar16 = (uint *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uStack_460 = *puVar16;
      }
      if (local_48c == 1) {
        uVar8 = _Precision & 0xffffffff;
        if (uVar8 < 0x29) {
          _Precision = CONCAT44(Width,Precision + 8);
          puVar12 = (undefined8 *)(uVar8 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar12 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        *(short *)*puVar12 = (short)iVar21;
      }
      else {
        uVar8 = _Precision & 0xffffffff;
        if (uVar8 < 0x29) {
          _Precision = CONCAT44(Width,Precision + 8);
          puVar12 = (undefined8 *)(uVar8 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar12 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        *(int *)*puVar12 = iVar21;
      }
    }
    else if (local_488 == 1) {
      if ((local_464 & 4) == 0) {
LAB_001f0463:
        uStack_4a8 = _Precision;
        TempBuffer[0] = (undefined1)ap[0].gp_offset;
        TempBuffer[1] = ap[0].gp_offset._1_1_;
        TempBuffer[2] = ap[0].gp_offset._2_1_;
        TempBuffer[3] = ap[0].gp_offset._3_1_;
        stack0xfffffffffffffb64 = ap[0].fp_offset;
        ap[0]._0_8_ = uVar20;
        iVar5 = vfprintf((FILE *)stream->bsdFilePtr,local_438,&uStack_4a8);
        PAL_printf_arg_remover((va_list *)&Precision,Flags,uStack_460,Type_00,uVar3);
        iVar21 = ap[0].reg_save_area._4_4_;
LAB_001f0578:
        pIVar7 = local_470;
        if (iVar5 == -1) {
          if (PAL_InitializeChakraCoreCalled == false) {
LAB_001f05b6:
            abort();
          }
        }
        else {
          iVar21 = iVar21 + iVar5;
        }
      }
      else {
        uVar8 = _Precision & 0xffffffff;
        if (uVar8 < 0x29) {
          _Precision = CONCAT44(Width,Precision + 8);
          pbVar11 = (byte *)(uVar8 + (long)ap[0].overflow_arg_area);
        }
        else {
          pbVar11 = (byte *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uStack_4a8._0_2_ = (ushort)*pbVar11;
        IVar4 = Internal_AddPaddingVfprintf(pCVar19,stream,(LPSTR)&uStack_4a8,Flags + -1,local_464);
        if (IVar4 == -1) goto LAB_001f05a6;
        iVar21 = iVar21 + IVar4;
        pIVar7 = pIVar10;
      }
    }
    else {
      if (local_488 != 2) {
        if (local_488 == 5 && (local_48c ^ 1) == 0) {
          uVar8 = _Precision & 0xffffffff;
          if (uVar8 < 0x29) {
            _Precision = CONCAT44(Width,Precision + 8);
            psVar14 = (short *)(uVar8 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar14 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar5 = fprintf((FILE *)stream->bsdFilePtr,local_438,(long)*psVar14);
        }
        else {
          if ((local_48c ^ 1) != 0 || local_488 != 4) goto LAB_001f0463;
          uVar8 = _Precision & 0xffffffff;
          if (uVar8 < 0x29) {
            _Precision = CONCAT44(Width,Precision + 8);
            psVar14 = (short *)(uVar8 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar14 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar5 = fprintf((FILE *)stream->bsdFilePtr,local_438,(ulong)(uint)(int)*psVar14);
        }
        goto LAB_001f0578;
      }
      if ((local_464 & 4) == 0) goto LAB_001f0463;
      uVar8 = _Precision & 0xffffffff;
      if (uVar8 < 0x29) {
        _Precision = CONCAT44(Width,Precision + 8);
        puVar12 = (undefined8 *)(uVar8 + (long)ap[0].overflow_arg_area);
      }
      else {
        puVar12 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      pCVar19 = (CPalThread *)*puVar12;
      pthrCurrent_00 = pCVar19;
      sVar13 = strlen((char *)pCVar19);
      IVar4 = Internal_AddPaddingVfprintf
                        (pthrCurrent_00,stream,(LPSTR)pCVar19,Flags - (int)sVar13,uVar18);
      if (IVar4 == -1) goto LAB_001f05a6;
      iVar21 = iVar21 + IVar4;
      pIVar7 = local_470;
    }
    goto LAB_001efe17;
  }
  if (Flags == -3) {
    if ((uint)Precision < 0x29) {
      _Precision = CONCAT44(Width,Precision + 8);
    }
    else {
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    IVar4 = -3;
  }
  else if (Flags == -2) {
    uVar8 = _Precision & 0xffffffff;
    if (uVar8 < 0x29) {
      _Precision = CONCAT44(Width,Precision + 8);
      pIVar7 = (INT *)(uVar8 + (long)ap[0].overflow_arg_area);
    }
    else {
      pIVar7 = (INT *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    IVar4 = *pIVar7;
    Flags = IVar4;
  }
  uVar8 = _Precision & 0xffffffff;
  if (uStack_460 == 0xfffffffc) {
    if ((uint)Precision < 0x29) {
      uVar8 = (ulong)(Precision + 8U);
      _Precision = CONCAT44(Width,Precision + 8U);
      uVar3 = 0xfffffffc;
      goto LAB_001f005d;
    }
    ap[0]._0_8_ = ap[0]._0_8_ + 8;
    uVar3 = 0xfffffffc;
LAB_001f0082:
    puVar12 = (undefined8 *)ap[0]._0_8_;
    ap[0]._0_8_ = ap[0]._0_8_ + 8;
  }
  else {
    uVar3 = uStack_460;
    if (uStack_460 == 0xfffffffe) {
      if ((uint)Precision < 0x29) {
        puVar16 = (uint *)((long)ap[0].overflow_arg_area + uVar8);
        uVar8 = (ulong)(Precision + 8U);
        _Precision = CONCAT44(Width,Precision + 8U);
      }
      else {
        puVar16 = (uint *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      uVar3 = *puVar16;
      uStack_460 = uVar3;
    }
LAB_001f005d:
    if (0x28 < (uint)uVar8) goto LAB_001f0082;
    _Precision = CONCAT44(Width,(uint)uVar8 + 8);
    puVar12 = (undefined8 *)(uVar8 + (long)ap[0].overflow_arg_area);
  }
  lpWideCharStr = (LPCWSTR)*puVar12;
  iVar21 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar21 == 0) {
    uVar20 = 0x8fb;
LAB_001f0641:
    fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
            ,uVar20);
    pFVar1 = _stderr;
    DVar6 = GetLastError();
    fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
    iVar21 = Fmt._4_4_;
    goto LAB_001f06db;
  }
  pCVar19 = (CPalThread *)(long)iVar21;
  lpMultiByteStr = (LPSTR)CorUnix::InternalMalloc((size_t)pCVar19);
  if (lpMultiByteStr == (LPSTR)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar15 = __errno_location();
      *piVar15 = 8;
      iVar21 = Fmt._4_4_;
      goto LAB_001f06db;
    }
    goto LAB_001f05b6;
  }
  pCVar9 = lpMultiByteStr;
  uVar18 = 0;
  Prefix = IVar4;
  if (uVar3 == 0xfffffffd) {
LAB_001f011f:
    *pCVar9 = '\0';
LAB_001f0148:
    IVar4 = Internal_AddPaddingVfprintf(pCVar19,stream,lpMultiByteStr,Prefix - uVar18,local_464);
    if (IVar4 != -1) {
      iVar21 = ap[0].reg_save_area._4_4_ + IVar4;
      CorUnix::InternalFree(lpMultiByteStr);
      pIVar7 = local_470;
      goto LAB_001efe17;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001f05b6;
  }
  else {
    uVar18 = iVar21 - 1;
    if (((int)uVar3 < 1) || ((int)uVar18 <= (int)uVar3)) {
      pCVar19 = (CPalThread *)0x0;
      iVar21 = WideCharToMultiByte(0,0,lpWideCharStr,-1,lpMultiByteStr,iVar21,(LPCSTR)0x0,
                                   (LPBOOL)0x0);
      if (iVar21 != 0) goto LAB_001f0148;
      uVar20 = 0x928;
    }
    else {
      pCVar19 = (CPalThread *)0x0;
      iVar21 = WideCharToMultiByte(0,0,lpWideCharStr,uVar3,lpMultiByteStr,iVar21,(LPCSTR)0x0,
                                   (LPBOOL)0x0);
      if (iVar21 != 0) {
        pCVar9 = lpMultiByteStr + iVar21;
        uVar18 = uVar3;
        goto LAB_001f011f;
      }
      uVar20 = 0x917;
    }
    fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
            ,uVar20);
    pFVar1 = _stderr;
    DVar6 = GetLastError();
    fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
  }
  CorUnix::InternalFree(lpMultiByteStr);
  iVar21 = Fmt._4_4_;
  goto LAB_001f06db;
}

Assistant:

int CoreVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;

    PERF_ENTRY(vfprintf);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                            &Width, &Precision,
                                            &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempStr,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    InternalFree(TempStr);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                ch,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                tempStr,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else
            {
                // Types that fprintf can handle.
                TempInt = 0;

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = fprintf(stream->bsdFilePtr, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = fprintf( stream->bsdFilePtr, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vfprintf(stream->bsdFilePtr, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 == TempInt)
                {
                    ERROR("vfprintf returned an error\n");
                }
                else
                {
                    written += TempInt;
                }
            }
        }
        else
        {

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr (stream->bsdFilePtr);
#endif

            InternalFwrite(Fmt++, 1, 1, stream->bsdFilePtr, &stream->PALferrorCode); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                PERF_EXIT(vfprintf);
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);

    PERF_EXIT(vfprintf);
    return written;
}